

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rkd_tree_builder.hpp
# Opt level: O1

vector<pico_tree::internal::rkd_tree_hh_data<pico_tree::internal::kd_tree_node_topological<int,_float>,_128UL>,_std::allocator<pico_tree::internal::rkd_tree_hh_data<pico_tree::internal::kd_tree_node_topological<int,_float>,_128UL>_>_>
* __thiscall
pico_tree::internal::
build_rkd_tree<pico_tree::internal::rkd_tree_hh_data<pico_tree::internal::kd_tree_node_topological<int,float>,128ul>,128ul>
::operator()(vector<pico_tree::internal::rkd_tree_hh_data<pico_tree::internal::kd_tree_node_topological<int,_float>,_128UL>,_std::allocator<pico_tree::internal::rkd_tree_hh_data<pico_tree::internal::kd_tree_node_topological<int,_float>,_128UL>_>_>
             *__return_storage_ptr__,void *this,
            space_wrapper<std::reference_wrapper<const_std::vector<std::array<float,_128UL>,_std::allocator<std::array<float,_128UL>_>_>_>_>
            space,splitter_stop_condition_t<pico_tree::max_leaf_size_t> *stop_condition,
            splitter_start_bounds_t<pico_tree::bounds_from_space_t> *start_bounds,
            splitter_rule_t<pico_tree::sliding_midpoint_max_side_t> *rule,size_t forest_size)

{
  node *pnVar1;
  space_type *psVar2;
  pointer paVar3;
  long lVar4;
  size_t extraout_RDX;
  pointer pfVar5;
  size_t extraout_RDX_00;
  size_t extraout_RDX_01;
  size_t extraout_RDX_02;
  size_t extraout_RDX_03;
  size_t extraout_RDX_04;
  size_t extraout_RDX_05;
  size_t extraout_RDX_06;
  size_t dim;
  size_t sVar6;
  long lVar7;
  long lVar8;
  float fVar9;
  kd_tree_data_type t;
  point<float,_128UL> r;
  size_t local_d20;
  pointer local_d18;
  pointer pfStack_d10;
  pointer local_d08;
  space_type *local_d00;
  splitter_stop_condition_t<pico_tree::max_leaf_size_t> *local_cf8;
  splitter_start_bounds_t<pico_tree::bounds_from_space_t> *local_cf0;
  splitter_rule_t<pico_tree::sliding_midpoint_max_side_t> *local_ce8;
  size_t local_ce0;
  kd_tree_data_type local_cd8;
  rkd_tree_hh_data<pico_tree::internal::kd_tree_node_topological<int,_float>,_128UL> local_890;
  point<float,_128UL> local_230;
  
  (__return_storage_ptr__->
  super__Vector_base<pico_tree::internal::rkd_tree_hh_data<pico_tree::internal::kd_tree_node_topological<int,_float>,_128UL>,_std::allocator<pico_tree::internal::rkd_tree_hh_data<pico_tree::internal::kd_tree_node_topological<int,_float>,_128UL>_>_>
  )._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (__return_storage_ptr__->
  super__Vector_base<pico_tree::internal::rkd_tree_hh_data<pico_tree::internal::kd_tree_node_topological<int,_float>,_128UL>,_std::allocator<pico_tree::internal::rkd_tree_hh_data<pico_tree::internal::kd_tree_node_topological<int,_float>,_128UL>_>_>
  )._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (__return_storage_ptr__->
  super__Vector_base<pico_tree::internal::rkd_tree_hh_data<pico_tree::internal::kd_tree_node_topological<int,_float>,_128UL>,_std::allocator<pico_tree::internal::rkd_tree_hh_data<pico_tree::internal::kd_tree_node_topological<int,_float>,_128UL>_>_>
  )._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_d00 = space.space_;
  local_cf8 = stop_condition;
  local_cf0 = start_bounds;
  local_ce8 = rule;
  std::
  vector<pico_tree::internal::rkd_tree_hh_data<pico_tree::internal::kd_tree_node_topological<int,_float>,_128UL>,_std::allocator<pico_tree::internal::rkd_tree_hh_data<pico_tree::internal::kd_tree_node_topological<int,_float>,_128UL>_>_>
  ::reserve(__return_storage_ptr__,forest_size);
  if (forest_size != 0) {
    sVar6 = 0;
    dim = extraout_RDX;
    do {
      random_normal<float,128ul>(&local_230,(internal *)0x80,dim);
      psVar2 = local_d00;
      matrix_space<float,_128UL>::matrix_space
                ((matrix_space<float,_128UL> *)&local_d20,
                 (long)(local_d00->_M_data->
                       super__Vector_base<std::array<float,_128UL>,_std::allocator<std::array<float,_128UL>_>_>
                       )._M_impl.super__Vector_impl_data._M_finish -
                 (long)(local_d00->_M_data->
                       super__Vector_base<std::array<float,_128UL>,_std::allocator<std::array<float,_128UL>_>_>
                       )._M_impl.super__Vector_impl_data._M_start >> 9,0x80);
      paVar3 = (psVar2->_M_data->
               super__Vector_base<std::array<float,_128UL>,_std::allocator<std::array<float,_128UL>_>_>
               )._M_impl.super__Vector_impl_data._M_start;
      lVar4 = (long)(psVar2->_M_data->
                    super__Vector_base<std::array<float,_128UL>,_std::allocator<std::array<float,_128UL>_>_>
                    )._M_impl.super__Vector_impl_data._M_finish - (long)paVar3;
      if (lVar4 != 0) {
        lVar4 = lVar4 >> 9;
        lVar7 = 0;
        pfVar5 = local_d18;
        do {
          fVar9 = 0.0;
          lVar8 = 0;
          do {
            fVar9 = fVar9 + local_230.elems_._M_elems[lVar8] * paVar3->_M_elems[lVar8];
            lVar8 = lVar8 + 1;
          } while (lVar8 != 0x80);
          lVar8 = 0;
          do {
            pfVar5[lVar8] =
                 local_230.elems_._M_elems[lVar8] * fVar9 * -2.0 + paVar3->_M_elems[lVar8];
            lVar8 = lVar8 + 1;
          } while (lVar8 != 0x80);
          lVar7 = lVar7 + 1;
          paVar3 = paVar3 + 1;
          pfVar5 = pfVar5 + 0x80;
        } while (lVar7 != lVar4 + (ulong)(lVar4 == 0));
      }
      local_ce0 = sVar6;
      build_kd_tree<pico_tree::internal::kd_tree_data<pico_tree::internal::kd_tree_node_topological<int,float>,128ul>,128ul>
      ::operator()(&local_cd8,&local_890,(space_type *)&local_d20,local_cf8,local_cf0,local_ce8);
      memcpy(&local_890,&local_230,0x200);
      local_890.space.storage_.size = local_d20;
      local_890.space.storage_.elems.super__Vector_base<float,_std::allocator<float>_>._M_impl.
      super__Vector_impl_data._M_start = local_d18;
      local_890.space.storage_.elems.super__Vector_base<float,_std::allocator<float>_>._M_impl.
      super__Vector_impl_data._M_finish = pfStack_d10;
      local_890.space.storage_.elems.super__Vector_base<float,_std::allocator<float>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage = local_d08;
      local_d08 = (pointer)0x0;
      local_d18 = (pointer)0x0;
      pfStack_d10 = (pointer)0x0;
      local_890.tree.indices.super__Vector_base<int,_std::allocator<int>_>._M_impl.
      super__Vector_impl_data._M_start =
           local_cd8.indices.super__Vector_base<int,_std::allocator<int>_>._M_impl.
           super__Vector_impl_data._M_start;
      local_890.tree.indices.super__Vector_base<int,_std::allocator<int>_>._M_impl.
      super__Vector_impl_data._M_finish =
           local_cd8.indices.super__Vector_base<int,_std::allocator<int>_>._M_impl.
           super__Vector_impl_data._M_finish;
      local_890.tree.indices.super__Vector_base<int,_std::allocator<int>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage =
           local_cd8.indices.super__Vector_base<int,_std::allocator<int>_>._M_impl.
           super__Vector_impl_data._M_end_of_storage;
      local_cd8.indices.super__Vector_base<int,_std::allocator<int>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      local_cd8.indices.super__Vector_base<int,_std::allocator<int>_>._M_impl.
      super__Vector_impl_data._M_start = (pointer)0x0;
      local_cd8.indices.super__Vector_base<int,_std::allocator<int>_>._M_impl.
      super__Vector_impl_data._M_finish = (pointer)0x0;
      memcpy(&local_890.tree.root_box,&local_cd8.root_box,0x400);
      local_890.tree.allocator.resource_._vptr_list_pool_resource =
           (_func_int **)&PTR__list_pool_resource_00111d80;
      local_890.tree.allocator.resource_.head_ = local_cd8.allocator.resource_.head_;
      local_cd8.allocator.resource_.head_ = (node *)0x0;
      local_890.tree.allocator.object_index_ = local_cd8.allocator.object_index_;
      local_890.tree.allocator.chunk_ = local_cd8.allocator.chunk_;
      local_890.tree.root_node = local_cd8.root_node;
      ::std::
      vector<pico_tree::internal::rkd_tree_hh_data<pico_tree::internal::kd_tree_node_topological<int,float>,128ul>,std::allocator<pico_tree::internal::rkd_tree_hh_data<pico_tree::internal::kd_tree_node_topological<int,float>,128ul>>>
      ::
      emplace_back<pico_tree::internal::rkd_tree_hh_data<pico_tree::internal::kd_tree_node_topological<int,float>,128ul>>
                ((vector<pico_tree::internal::rkd_tree_hh_data<pico_tree::internal::kd_tree_node_topological<int,float>,128ul>,std::allocator<pico_tree::internal::rkd_tree_hh_data<pico_tree::internal::kd_tree_node_topological<int,float>,128ul>>>
                  *)__return_storage_ptr__,&local_890);
      local_890.tree.allocator.resource_._vptr_list_pool_resource =
           (_func_int **)&PTR__list_pool_resource_00111d80;
      dim = extraout_RDX_00;
      while (local_890.tree.allocator.resource_.head_ != (node *)0x0) {
        pnVar1 = (local_890.tree.allocator.resource_.head_)->prev;
        operator_delete(local_890.tree.allocator.resource_.head_,0x2808);
        dim = extraout_RDX_01;
        local_890.tree.allocator.resource_.head_ = pnVar1;
      }
      if (local_890.tree.indices.super__Vector_base<int,_std::allocator<int>_>._M_impl.
          super__Vector_impl_data._M_start != (pointer)0x0) {
        operator_delete(local_890.tree.indices.super__Vector_base<int,_std::allocator<int>_>._M_impl
                        .super__Vector_impl_data._M_start,
                        (long)local_890.tree.indices.super__Vector_base<int,_std::allocator<int>_>.
                              _M_impl.super__Vector_impl_data._M_end_of_storage -
                        (long)local_890.tree.indices.super__Vector_base<int,_std::allocator<int>_>.
                              _M_impl.super__Vector_impl_data._M_start);
        dim = extraout_RDX_02;
      }
      if (local_890.space.storage_.elems.super__Vector_base<float,_std::allocator<float>_>._M_impl.
          super__Vector_impl_data._M_start != (pointer)0x0) {
        operator_delete(local_890.space.storage_.elems.
                        super__Vector_base<float,_std::allocator<float>_>._M_impl.
                        super__Vector_impl_data._M_start,
                        (long)local_890.space.storage_.elems.
                              super__Vector_base<float,_std::allocator<float>_>._M_impl.
                              super__Vector_impl_data._M_end_of_storage -
                        (long)local_890.space.storage_.elems.
                              super__Vector_base<float,_std::allocator<float>_>._M_impl.
                              super__Vector_impl_data._M_start);
        dim = extraout_RDX_03;
      }
      local_cd8.allocator.resource_._vptr_list_pool_resource =
           (_func_int **)&PTR__list_pool_resource_00111d80;
      while (local_cd8.allocator.resource_.head_ != (node *)0x0) {
        pnVar1 = (local_cd8.allocator.resource_.head_)->prev;
        operator_delete(local_cd8.allocator.resource_.head_,0x2808);
        dim = extraout_RDX_04;
        local_cd8.allocator.resource_.head_ = pnVar1;
      }
      if (local_cd8.indices.super__Vector_base<int,_std::allocator<int>_>._M_impl.
          super__Vector_impl_data._M_start != (pointer)0x0) {
        operator_delete(local_cd8.indices.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                        super__Vector_impl_data._M_start,
                        (long)local_cd8.indices.super__Vector_base<int,_std::allocator<int>_>.
                              _M_impl.super__Vector_impl_data._M_end_of_storage -
                        (long)local_cd8.indices.super__Vector_base<int,_std::allocator<int>_>.
                              _M_impl.super__Vector_impl_data._M_start);
        dim = extraout_RDX_05;
      }
      sVar6 = local_ce0;
      if (local_d18 != (pointer)0x0) {
        operator_delete(local_d18,(long)local_d08 - (long)local_d18);
        dim = extraout_RDX_06;
      }
      sVar6 = sVar6 + 1;
    } while (sVar6 != forest_size);
  }
  return __return_storage_ptr__;
}

Assistant:

std::vector<rkd_tree_data_type> operator()(
      SpaceWrapper_ space,
      splitter_stop_condition_t<Stop_> const& stop_condition,
      splitter_start_bounds_t<Bounds_> const& start_bounds,
      splitter_rule_t<Rule_> const& rule,
      size_t forest_size) {
    assert(forest_size > 0);

    using space_wrapper_type = typename rkd_tree_data_type::space_wrapper_type;
    using build_kd_tree_type = build_kd_tree<kd_tree_data_type, Dim_>;

    std::vector<rkd_tree_data_type> trees;
    trees.reserve(forest_size);
    for (std::size_t i = 0; i < forest_size; ++i) {
      auto r = rkd_tree_data_type::random_rotation(space);
      auto s = rkd_tree_data_type::rotate_space(r, space);
      auto t = build_kd_tree_type()(
          space_wrapper_type(s), stop_condition, start_bounds, rule);
      trees.push_back({std::move(r), std::move(s), std::move(t)});
    }
    return trees;
  }